

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O1

bool cmGlobalGenerator::IsReservedTarget(string *name)

{
  static_string_view *psVar1;
  
  if (IsReservedTarget(std::__cxx11::string_const&)::reservedTargets == '\0') {
    IsReservedTarget();
  }
  psVar1 = std::
           __find_if<cm::static_string_view_const*,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                     (IsReservedTarget::reservedTargets,
                      &IsReservedTarget(std::__cxx11::string_const&)::reservedTargets,name);
  return psVar1 != (static_string_view *)
                   &IsReservedTarget(std::__cxx11::string_const&)::reservedTargets;
}

Assistant:

bool cmGlobalGenerator::IsReservedTarget(std::string const& name)
{
  // The following is a list of targets reserved
  // by one or more of the cmake generators.

  // Adding additional targets to this list will require a policy!
  static const cm::static_string_view reservedTargets[] = {
    "all"_s,           "ALL_BUILD"_s,  "help"_s,  "install"_s,
    "INSTALL"_s,       "preinstall"_s, "clean"_s, "edit_cache"_s,
    "rebuild_cache"_s, "ZERO_CHECK"_s
  };

  return cm::contains(reservedTargets, name);
}